

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O3

void test_sfd_exchange(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  int local_98;
  short local_94;
  char buf_ [64];
  size_t local_50;
  size_t sz_;
  int fds [2];
  nng_listener l1;
  nng_listener l2;
  nng_socket s1;
  nng_socket s2;
  
  nVar1 = nng_socket_pair((int *)&sz_);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x90,"%s: expected success, got %s (%d)","nng_socket_pair(fds)",pcVar4,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open((nng_socket *)&l1);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                           ,0x91,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_pair1_open((nng_socket *)&l2);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                             ,0x92,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",
                             pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_listener_create((nng_listener *)fds,(nng_socket)l1.id,"socket://");
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                               ,0x93,"%s: expected success, got %s (%d)",
                               "nng_listener_create(&l1, s1, \"socket://\")",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_listener_start((nng_listener)fds[0],0);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                 ,0x94,"%s: expected success, got %s (%d)",
                                 "nng_listener_start(l1, 0)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_listener_set_int((nng_listener)fds[0],"socket:fd",(int)sz_);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                   ,0x95,"%s: expected success, got %s (%d)",
                                   "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds[0])",pcVar4,
                                   nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_listener_create((nng_listener *)(fds + 1),(nng_socket)l2.id,"socket://");
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x96,"%s: expected success, got %s (%d)",
                                     "nng_listener_create(&l2, s2, \"socket://\")",pcVar4,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_listener_start((nng_listener)fds[1],0);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                       ,0x97,"%s: expected success, got %s (%d)",
                                       "nng_listener_start(l2, 0)",pcVar4,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_listener_set_int((nng_listener)fds[1],"socket:fd",sz_._4_4_);
                  pcVar4 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                         ,0x98,"%s: expected success, got %s (%d)",
                                         "nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds[1])",
                                         pcVar4,nVar1);
                  if (iVar2 != 0) {
                    nuts_sleep(10);
                    nVar1 = nng_send((nng_socket)l1.id,"hello",6,0);
                    pcVar4 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                           ,0x9a,"%s: expected success, got %s (%d)",
                                           "nng_send(s1, \"hello\", strlen(\"hello\") + 1, 0)",
                                           pcVar4,nVar1);
                    if (iVar2 != 0) {
                      local_50 = 0x40;
                      nVar3 = nng_recv((nng_socket)l2.id,&local_98,&local_50,0);
                      pcVar4 = nng_strerror(nVar3);
                      acutest_check_((uint)(nVar3 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x9b,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                      acutest_check_((uint)(local_50 == 6),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x9b,"length %d want %d",local_50,6);
                      buf_[0x37] = '\0';
                      acutest_check_((uint)(local_94 == 0x6f && local_98 == 0x6c6c6568),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                     ,0x9b,"%s == %s","hello",&local_98);
                      nVar1 = nng_send((nng_socket)l2.id,"there",6,0);
                      pcVar4 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                             ,0x9c,"%s: expected success, got %s (%d)",
                                             "nng_send(s2, \"there\", strlen(\"there\") + 1, 0)",
                                             pcVar4,nVar1);
                      if (iVar2 != 0) {
                        local_50 = 0x40;
                        nVar3 = nng_recv((nng_socket)l1.id,&local_98,&local_50,0);
                        pcVar4 = nng_strerror(nVar3);
                        acutest_check_((uint)(nVar3 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                       ,0x9d,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                        acutest_check_((uint)(local_50 == 6),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                       ,0x9d,"length %d want %d",local_50,6);
                        buf_[0x37] = '\0';
                        acutest_check_((uint)(local_94 == 0x65 && local_98 == 0x72656874),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                       ,0x9d,"%s == %s","there",&local_98);
                        nVar1 = nng_socket_close((nng_socket)l1.id);
                        pcVar4 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                               ,0x9f,"%s: expected success, got %s (%d)",
                                               "nng_socket_close(s1)",pcVar4,nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_socket_close((nng_socket)l2.id);
                          pcVar4 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                                                 ,0xa0,"%s: expected success, got %s (%d)",
                                                 "nng_socket_close(s2)",pcVar4,nVar1);
                          if (iVar2 != 0) {
                            close(sz_._4_4_);
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_sfd_exchange(void)
{
#ifdef NNG_HAVE_SOCKETPAIR
	nng_socket   s1, s2;
	nng_listener l1, l2;
	int          fds[2];

	NUTS_PASS(nng_socket_pair(fds));
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_listener_create(&l1, s1, "socket://"));
	NUTS_PASS(nng_listener_start(l1, 0));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds[0]));
	NUTS_PASS(nng_listener_create(&l2, s2, "socket://"));
	NUTS_PASS(nng_listener_start(l2, 0));
	NUTS_PASS(nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds[1]));
	NUTS_SLEEP(10);
	NUTS_SEND(s1, "hello");
	NUTS_RECV(s2, "hello");
	NUTS_SEND(s2, "there");
	NUTS_RECV(s1, "there");

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	close(fds[1]);
#else
	NUTS_SKIP("no socketpair");
#endif
}